

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void rw::flipDXT5(uint8 *dst,uint8 *src,uint32 width,uint32 height)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint8 *puVar5;
  int iVar6;
  uint8 *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint8 *puVar13;
  ulong uVar14;
  
  uVar1 = width + 3;
  uVar4 = uVar1 >> 2;
  if (height < 4) {
    if (height != 2) {
      memcpy(dst,src,(ulong)(uVar4 << 4));
      return;
    }
    if (3 < uVar1) {
      lVar2 = 0;
      do {
        dst[lVar2] = src[lVar2];
        dst[lVar2 + 1] = src[lVar2 + 1];
        uVar14 = *(ulong *)(src + lVar2 + 2);
        *(short *)(dst + lVar2 + 6) = (short)(uVar14 >> 0x20);
        *(uint *)(dst + lVar2 + 2) =
             ((uint)uVar14 & 0xfff) << 0xc |
             (uint)(uVar14 >> 0xc) & 0xfff | (uint)uVar14 & 0xff000000;
        dst[lVar2 + 8] = src[lVar2 + 8];
        dst[lVar2 + 9] = src[lVar2 + 9];
        dst[lVar2 + 10] = src[lVar2 + 10];
        dst[lVar2 + 0xb] = src[lVar2 + 0xb];
        dst[lVar2 + 0xc] = src[lVar2 + 0xd];
        dst[lVar2 + 0xd] = src[lVar2 + 0xc];
        dst[lVar2 + 0xe] = src[lVar2 + 0xe];
        dst[lVar2 + 0xf] = src[lVar2 + 0xf];
        lVar2 = lVar2 + 0x10;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  else if (3 < height + 3) {
    uVar3 = height + 3 >> 2;
    uVar8 = uVar4 * 0x10;
    puVar7 = dst + uVar8 * uVar3;
    uVar9 = 0;
    do {
      puVar7 = puVar7 + -(ulong)uVar8;
      if (3 < uVar1) {
        uVar10 = 0;
        puVar5 = puVar7;
        puVar13 = src;
        do {
          *puVar5 = *puVar13;
          puVar5[1] = puVar13[1];
          uVar14 = *(ulong *)(puVar13 + 2);
          iVar6 = 4;
          uVar11 = 0;
          do {
            uVar12 = uVar11 << 0xc;
            uVar11 = (uint)uVar14 & 0xfff | uVar12;
            uVar14 = uVar14 >> 0xc;
            iVar6 = iVar6 + -1;
          } while (iVar6 != 0);
          *(int *)(puVar5 + 2) = (int)uVar11;
          *(short *)(puVar5 + 6) = (short)(uVar12 >> 0x20);
          puVar5[8] = puVar13[8];
          puVar5[9] = puVar13[9];
          puVar5[10] = puVar13[10];
          puVar5[0xb] = puVar13[0xb];
          puVar5[0xc] = puVar13[0xf];
          puVar5[0xd] = puVar13[0xe];
          puVar5[0xe] = puVar13[0xd];
          puVar5[0xf] = puVar13[0xc];
          puVar13 = puVar13 + 0x10;
          puVar5 = puVar5 + 0x10;
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar4);
      }
      src = src + uVar8;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
  }
  return;
}

Assistant:

void
flipDXT5(uint8 *dst, uint8 *src, uint32 width, uint32 height)
{
	int x, y;
	int bw = (width+3)/4;
	int bh = (height+3)/4;
	if(height < 4){
		// used pixels are always at the top
		// so don't swap the full 4 rows
		if(height == 2){
			uint8 *s = src;
			uint8 *d = dst;
			for(x = 0; x < bw; x++){
				flipAlphaBlock5_half(d, s);
				flipBlock_half(d+8, s+8);
				s += 16;
				d += 16;
			}
		}else
			memcpy(dst, src, 16*bw);
		return;
	}
	dst += 16*bw*bh;
	for(y = 0; y < bh; y++){
		dst -= 16*bw;
		uint8 *s = src;
		uint8 *d = dst;
		for(x = 0; x < bw; x++){
			flipAlphaBlock5(d, s);
			flipBlock(d+8, s+8);
			s += 16;
			d += 16;
		}
		src += 16*bw;
	}
}